

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::getExpectedPrimitivesSubmittedQueryResult
          (PipelineStatisticsQueryTestFunctional3 *this,_primitive_type current_primitive_type,
          uint *out_results_written,GLuint64 *out_results)

{
  bool bVar1;
  _draw_call_type _Var2;
  uint uVar3;
  ulong uVar4;
  TestError *this_00;
  uint uVar5;
  long lVar6;
  ulong uStack_20;
  
  uVar5 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
          m_indirect_draw_call_count_argument;
  *out_results_written = 0;
  if (PRIMITIVE_TYPE_TRIANGLES_ADJACENCY < current_primitive_type) {
switchD_00ac4229_caseD_5:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized primitive type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
               ,0xceb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = this->m_is_primitive_restart_enabled;
  uVar3 = uVar5 - bVar1;
  switch(current_primitive_type) {
  case PRIMITIVE_TYPE_FIRST:
    uVar4 = (ulong)uVar3;
    break;
  case PRIMITIVE_TYPE_LINE_LOOP:
    *out_results_written = 1;
    if (2 < uVar3) {
      uVar4 = (ulong)uVar3;
      goto LAB_00ac42ca;
    }
    if (uVar3 == 2) {
      *out_results = 1;
    }
    else {
      *out_results = 0;
    }
    goto LAB_00ac42cd;
  case PRIMITIVE_TYPE_LINE_STRIP:
    if (1 < uVar3) {
      uVar4 = (ulong)(uVar3 - 1);
      break;
    }
    *out_results_written = 1;
    *out_results = 0;
    if (uVar3 != 1) goto LAB_00ac42cd;
LAB_00ac42e1:
    *out_results_written = 2;
    out_results[1] = 1;
    goto LAB_00ac42f0;
  case PRIMITIVE_TYPE_LINES:
    uVar5 = uVar3 >> 1;
    *out_results_written = 1;
    *out_results = (ulong)uVar5;
    uVar3 = uVar3 & 1;
    goto joined_r0x00ac424d;
  case PRIMITIVE_TYPE_LINES_ADJACENCY:
    uVar5 = uVar3 >> 2;
    *out_results_written = 1;
    *out_results = (ulong)uVar5;
    uVar3 = uVar3 & 3;
joined_r0x00ac424d:
    if (uVar3 != 0) {
      *out_results_written = 2;
      out_results[1] = (ulong)(uVar5 + 1);
LAB_00ac42f0:
      uStack_20 = 2;
      goto LAB_00ac42f2;
    }
    goto LAB_00ac42cd;
  case PRIMITIVE_TYPE_PATCHES:
    goto switchD_00ac4229_caseD_5;
  default:
    if (uVar3 < 3) {
      *out_results_written = 1;
      *out_results = 0;
      if (uVar5 != bVar1) goto LAB_00ac42e1;
      goto LAB_00ac42cd;
    }
    uVar4 = (ulong)(uVar3 - 2);
    break;
  case PRIMITIVE_TYPE_TRIANGLES:
    uStack_20 = 3;
    goto LAB_00ac4265;
  case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
    uStack_20 = 6;
LAB_00ac4265:
    uVar4 = uVar3 / uStack_20;
    *out_results_written = 1;
    *out_results = uVar4;
    if ((int)((ulong)uVar3 % uStack_20) != 0) {
      *out_results_written = 2;
      out_results[1] = (ulong)((int)uVar4 + 1);
      goto LAB_00ac42f0;
    }
    goto LAB_00ac42cd;
  }
  *out_results_written = 1;
LAB_00ac42ca:
  *out_results = uVar4;
LAB_00ac42cd:
  uStack_20 = 1;
LAB_00ac42f2:
  _Var2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  if ((_Var2 < DRAW_CALL_TYPE_GLDRAWRANGEELEMENTS) && ((0x3ceU >> (_Var2 & 0x1f) & 1) != 0)) {
    uVar5 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
            m_indirect_draw_call_primcount_argument;
    for (lVar6 = 0; uStack_20 != lVar6; lVar6 = lVar6 + 1) {
      out_results[lVar6] = out_results[lVar6] * (ulong)uVar5;
    }
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional3::getExpectedPrimitivesSubmittedQueryResult(
	PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type, unsigned int* out_results_written,
	glw::GLuint64 out_results[4])
{
	unsigned int n_input_vertices = m_indirect_draw_call_count_argument;

	*out_results_written = 0;

	/* Sanity checks */
	DE_ASSERT(current_primitive_type != PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES);

	/* Carry on */
	if (m_is_primitive_restart_enabled)
	{
		/* Primitive restart functionality in our test removes a single index.
		 *
		 * Note: This also applies to arrayed draw calls, since we're testing
		 *       GL_PRIMITIVE_RESTART rendering mode, and we're using a primitive
		 *       restart index of 0.
		 **/
		n_input_vertices--;
	}

	switch (current_primitive_type)
	{
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_POINTS:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_LOOP:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices;
		}
		else if (n_input_vertices > 1)
		{
			out_results[(*out_results_written)++] = 1;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;
		}

		break;
	} /* PRIMITIVE_TYPE_LINE_LOOP */

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_FAN:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 2;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices >= 1)
			{
				/* If the submitted triangle fan is incomplete, also include the case
				 * where the incomplete triangle fan's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_STRIP:
	{
		if (n_input_vertices > 1)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 1;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices > 0)
			{
				/* If the submitted line strip is incomplete, also include the case
				 * where the incomplete line's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_STRIP:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 2;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices >= 1)
			{
				/* If the submitted triangle strip is incomplete, also include the case
				 * where the incomplete triangle's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 2) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 2 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES_ADJACENCY:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 4;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 4) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 4 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 3;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 3) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 3 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 6;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 6) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 6 + 1;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized primitive type");
	}
	} /* switch (current_primitive_type) */

	if (PipelineStatisticsQueryUtilities::isInstancedDrawCall(m_current_draw_call_type))
	{
		for (unsigned int i = 0; i < *out_results_written; ++i)
		{
			out_results[i] *= m_indirect_draw_call_primcount_argument;
		}
	} /* if (instanced draw call type) */
}